

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_utf_decode(char *c,nk_rune *u,int clen)

{
  uint i;
  ulong uVar1;
  ulong uVar2;
  nk_rune nVar3;
  long lVar4;
  bool bVar5;
  
  if (clen == 0 || (u == (nk_rune *)0x0 || c == (char *)0x0)) {
    return 0;
  }
  *u = 0xfffd;
  uVar2 = 0;
  do {
    if ((nk_utfmask[uVar2] & *c) == nk_utfbyte[uVar2]) {
      i = (uint)uVar2;
      uVar1 = 1;
      if (2 < i - 1) goto LAB_001082b6;
      nVar3 = (nk_rune)(byte)(*c & ~nk_utfmask[uVar2]);
      bVar5 = uVar2 >= 2;
      if (uVar2 < 2 || clen < 2) goto LAB_0010829e;
      uVar1 = 1;
      goto LAB_00108254;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 5);
  uVar1 = 1;
  goto LAB_001082b6;
  while( true ) {
    nVar3 = nVar3 << 6 | (uint)(byte)(c[uVar1] & ~nk_utfmask[lVar4]);
    uVar1 = uVar1 + 1;
    bVar5 = (uint)uVar1 < i;
    if (((uint)clen <= uVar1) || (i <= (uint)uVar1)) break;
LAB_00108254:
    lVar4 = 0;
    while ((nk_utfmask[lVar4] & c[uVar1]) != nk_utfbyte[lVar4]) {
      lVar4 = lVar4 + 1;
      if (lVar4 == 5) goto LAB_001082b6;
    }
    if (lVar4 != 0) goto LAB_001082b6;
  }
LAB_0010829e:
  if (bVar5) {
    uVar1 = 0;
  }
  else {
    *u = nVar3;
    nk_utf_validate(u,i);
    uVar1 = uVar2 & 0xffffffff;
  }
LAB_001082b6:
  return (int)uVar1;
}

Assistant:

NK_API int
nk_utf_decode(const char *c, nk_rune *u, int clen)
{
int i, j, len, type=0;
nk_rune udecoded;

NK_ASSERT(c);
NK_ASSERT(u);

if (!c || !u) return 0;
if (!clen) return 0;
*u = NK_UTF_INVALID;

udecoded = nk_utf_decode_byte(c[0], &len);
if (!NK_BETWEEN(len, 1, NK_UTF_SIZE))
return 1;

for (i = 1, j = 1; i < clen && j < len; ++i, ++j) {
udecoded = (udecoded << 6) | nk_utf_decode_byte(c[i], &type);
if (type != 0)
return j;
}
if (j < len)
return 0;
*u = udecoded;
nk_utf_validate(u, len);
return len;
}